

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O3

int __thiscall QFontEngine::glyphCount(QFontEngine *this)

{
  char *pcVar1;
  uint uVar2;
  long in_FS_OFFSET;
  QByteArray local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  getSfntTable(&local_38,this,0x6d617870);
  uVar2 = 0;
  if ((undefined1 *)0x5 < (ulong)local_38.d.size) {
    pcVar1 = local_38.d.ptr;
    if (local_38.d.ptr == (char *)0x0) {
      pcVar1 = (char *)&QByteArray::_empty;
    }
    uVar2 = (uint)(ushort)(*(ushort *)(pcVar1 + 4) << 8 | *(ushort *)(pcVar1 + 4) >> 8);
  }
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QFontEngine::glyphCount() const
{
    QByteArray maxpTable = getSfntTable(QFont::Tag("maxp").value());
    if (maxpTable.size() < 6)
        return 0;

    const uchar *source = reinterpret_cast<const uchar *>(maxpTable.constData() + 4);
    const uchar *end = source + maxpTable.size();

    quint16 count = 0;
    qSafeFromBigEndian(source, end, &count);
    return count;
}